

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_while_stmt_flat(SyntaxAnalyze *this)

{
  irGenerator *this_00;
  size_t sVar1;
  size_t sVar2;
  LabelId bbTrue;
  LabelId bbFalse;
  LabelId label;
  WhileLabels wl;
  SharedExNdPtr cond;
  RightVal right;
  string tmpName;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> condStr
  ;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->irGenerator;
  bbTrue = irGenerator::irGenerator::getNewLabelId(this_00);
  bbFalse = irGenerator::irGenerator::getNewLabelId(this_00);
  label = irGenerator::irGenerator::getNewLabelId(this_00);
  condStr.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  wl._endLabel = bbFalse;
  wl._beginLabel = label;
  irGenerator::irGenerator::pushWhile(this_00,wl);
  match_one_word(this,WHILETK);
  match_one_word(this,LPARENT);
  sVar1 = this->matched_index;
  gm_cond((SyntaxAnalyze *)&right);
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&right);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&right.
                     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_> + 8))
  ;
  if ((cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type == CNS) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&tmpName,this_00,Int);
    right.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
    _M_storage = (_Uninitialized<int,_true>)0;
    right.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,int,std::__cxx11::string> *)&right,
               &(cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_value);
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_58,&tmpName);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_80,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&right);
    irGenerator::irGenerator::ir_assign(this_00,(LeftVal *)&local_58,(RightVal *)&local_80);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_80);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_58);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&condStr,&tmpName);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&right);
    std::__cxx11::string::~string((string *)&tmpName);
  }
  else {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&condStr,
               &(cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name);
  }
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)&local_a8,
                   &condStr.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  );
  irGenerator::irGenerator::ir_jump
            (this_00,BrCond,bbTrue,bbFalse,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8,Loop);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_a8);
  irGenerator::irGenerator::ir_label(this_00,bbTrue);
  match_one_word(this,RPARENT);
  gm_stmt(this);
  irGenerator::irGenerator::ir_label(this_00,label);
  sVar2 = this->matched_index;
  this->matched_index = (ulong)(uint)sVar1;
  gm_cond((SyntaxAnalyze *)&right);
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&right);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&right.
                     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_> + 8))
  ;
  this->matched_index = (ulong)(uint)sVar2;
  if ((cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type == CNS) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&tmpName,this_00,Int);
    right.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
    _M_storage = (_Uninitialized<int,_true>)0;
    right.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,int,std::__cxx11::string> *)&right,
               &(cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_value);
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_d0,&tmpName);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_f8,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&right);
    irGenerator::irGenerator::ir_assign(this_00,(LeftVal *)&local_d0,(RightVal *)&local_f8);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_f8);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_d0);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&condStr,&tmpName);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&right);
    std::__cxx11::string::~string((string *)&tmpName);
  }
  else {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&condStr,
               &(cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name);
  }
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)&local_120,
                   &condStr.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  );
  irGenerator::irGenerator::ir_jump
            (this_00,BrCond,bbTrue,bbFalse,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_120,Loop);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_120);
  irGenerator::irGenerator::ir_label(this_00,bbFalse);
  irGenerator::irGenerator::popWhile(this_00);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&condStr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void SyntaxAnalyze::gm_while_stmt_flat() {
  SharedExNdPtr cond;
  LabelId whileTrue = irGenerator.getNewLabelId();
  LabelId whileEnd = irGenerator.getNewLabelId();
  LabelId whileBegin = irGenerator.getNewLabelId();
  std::optional<string> condStr;
  irGenerator::WhileLabels whileLabels =
      irGenerator::WhileLabels(whileBegin, whileEnd);
  uint32_t condIndex;
  uint32_t endWhileIndex;

  irGenerator.pushWhile(whileLabels);

  match_one_word(Token::WHILETK);
  match_one_word(Token::LPARENT);

  condIndex = get_matched_index();
  cond = gm_cond();

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, whileTrue,
                      whileEnd, condStr, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileTrue);

  match_one_word(Token::RPARENT);

  gm_stmt();

  irGenerator.ir_label(whileBegin);

  endWhileIndex = get_matched_index();
  set_matched_index(condIndex);
  cond = gm_cond();
  set_matched_index(endWhileIndex);

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, whileTrue,
                      whileEnd, condStr, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileEnd);

  irGenerator.popWhile();
}